

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::Init(Client *this,char *ip,int portno)

{
  uint16_t uVar1;
  int iVar2;
  hostent *phVar3;
  undefined8 uVar4;
  int portno_local;
  char *ip_local;
  Client *this_local;
  
  iVar2 = socket(2,1,0);
  this->sockfd = iVar2;
  if (this->sockfd < 0) {
    std::__cxx11::string::c_str();
    printf("ERROR opening client socket in %s!\n");
  }
  phVar3 = gethostbyname(ip);
  this->server = (hostent *)phVar3;
  if (this->server == (hostent *)0x0) {
    fprintf(_stderr,"ERROR, no such host(Server is not live)!\n");
  }
  memset(&this->serv_addr,0,0x10);
  (this->serv_addr).sin_family = 2;
  memmove(&(this->serv_addr).sin_addr,*this->server->h_addr_list,(long)this->server->h_length);
  uVar1 = htons((uint16_t)portno);
  (this->serv_addr).sin_port = uVar1;
  iVar2 = connect(this->sockfd,(sockaddr *)&this->serv_addr,0x10);
  if (iVar2 < 0) {
    uVar4 = std::__cxx11::string::c_str();
    printf("ERROR connecting %s to Server!\n",uVar4);
  }
  return;
}

Assistant:

void Client::Init(char *ip, int portno)
{
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd < 0)
        printf("ERROR opening client socket in %s!\n", name.c_str());
    server = gethostbyname(ip);
    if (server == NULL)
    {
        fprintf(stderr, "ERROR, no such host(Server is not live)!\n");
        //exit(0);
    }
    bzero((char *)&serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    bcopy((char *)server->h_addr,
          (char *)&serv_addr.sin_addr.s_addr,
          server->h_length);
    serv_addr.sin_port = htons(portno);
    if (connect(sockfd, (struct sockaddr *)&serv_addr, sizeof(serv_addr)) < 0)
        printf("ERROR connecting %s to Server!\n", name.c_str());
    
}